

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::~IfcRamp(IfcRamp *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x839cd0;
  *(undefined8 *)&this->field_0x30 = 0x839de8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x839cf8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x839d20;
  *(undefined8 *)&this[-1].field_0x118 = 0x839d48;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x839d70;
  *(undefined8 *)&this[-1].field_0x180 = 0x839d98;
  *(undefined8 *)this = 0x839dc0;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__00839e08);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}